

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O0

void __thiscall
btPoint2PointConstraint::getInfo2NonVirtual
          (btPoint2PointConstraint *this,btConstraintInfo2 *info,btTransform *body0_trans,
          btTransform *body1_trans)

{
  btScalar *pbVar1;
  btVector3 *pbVar2;
  btTransform *in_RCX;
  btTransform *in_RDX;
  float *in_RSI;
  btPoint2PointConstraint *in_RDI;
  float fVar3;
  btScalar impulseClamp;
  int j;
  btScalar k;
  btScalar currERP;
  btVector3 *angular2_1;
  btVector3 *angular1_1;
  btVector3 *angular0_1;
  btVector3 a2;
  btVector3 a1neg;
  btVector3 *angular2;
  btVector3 *angular1;
  btVector3 *angular0;
  btVector3 a1;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  btScalar bVar4;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  float fVar5;
  undefined4 in_stack_ffffffffffffff54;
  int local_8c;
  undefined4 in_stack_ffffffffffffff78;
  float fVar6;
  undefined4 in_stack_ffffffffffffff7c;
  btVector3 *in_stack_ffffffffffffff80;
  btVector3 *in_stack_ffffffffffffff88;
  btVector3 *in_stack_ffffffffffffff90;
  btVector3 local_68;
  btScalar local_58 [4];
  long local_48;
  long local_40;
  undefined8 local_38;
  btVector3 local_30;
  btTransform *local_20;
  btTransform *local_18;
  float *local_10;
  
  **(undefined4 **)(in_RSI + 2) = 0x3f800000;
  *(undefined4 *)(*(long *)(in_RSI + 2) + 4 + (long)(int)in_RSI[10] * 4) = 0x3f800000;
  *(undefined4 *)(*(long *)(in_RSI + 2) + 8 + (long)((int)in_RSI[10] * 2) * 4) = 0x3f800000;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btTransform::getBasis(in_RDX);
  getPivotInA(in_RDI);
  local_30 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
  ;
  local_38 = *(undefined8 *)(local_10 + 4);
  local_40 = *(long *)(local_10 + 4) + (long)(int)local_10[10] * 4;
  local_48 = *(long *)(local_10 + 4) + (long)((int)local_10[10] * 2) * 4;
  local_58 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  btVector3::getSkewSymmetricMatrix
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  **(undefined4 **)(local_10 + 6) = 0xbf800000;
  *(undefined4 *)(*(long *)(local_10 + 6) + 4 + (long)(int)local_10[10] * 4) = 0xbf800000;
  *(undefined4 *)(*(long *)(local_10 + 6) + 8 + (long)((int)local_10[10] * 2) * 4) = 0xbf800000;
  btTransform::getBasis(local_20);
  getPivotInB(in_RDI);
  local_68 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
  ;
  btVector3::getSkewSymmetricMatrix
            (*(btVector3 **)(local_10 + 8),
             (btVector3 *)(*(long *)(local_10 + 8) + (long)(int)local_10[10] * 4),
             (btVector3 *)(*(long *)(local_10 + 8) + (long)((int)local_10[10] << 1) * 4),
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((in_RDI->m_flags & 1U) == 0) {
    bVar4 = local_10[1];
  }
  else {
    bVar4 = in_RDI->m_erp;
  }
  fVar5 = *local_10 * bVar4;
  for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
    fVar6 = fVar5;
    pbVar1 = btVector3::operator_cast_to_float_(&local_68);
    bVar4 = pbVar1[local_8c];
    pbVar2 = btTransform::getOrigin(local_20);
    pbVar1 = btVector3::operator_cast_to_float_(pbVar2);
    fVar3 = bVar4 + pbVar1[local_8c];
    pbVar1 = btVector3::operator_cast_to_float_(&local_30);
    fVar3 = fVar3 - pbVar1[local_8c];
    pbVar2 = btTransform::getOrigin(local_18);
    pbVar1 = btVector3::operator_cast_to_float_(pbVar2);
    *(float *)(*(long *)(local_10 + 0xc) + (long)(local_8c * (int)local_10[10]) * 4) =
         fVar5 * (fVar3 - pbVar1[local_8c]);
    fVar5 = fVar6;
  }
  if ((in_RDI->m_flags & 2U) != 0) {
    for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
      *(btScalar *)(*(long *)(local_10 + 0xe) + (long)(local_8c * (int)local_10[10]) * 4) =
           in_RDI->m_cfm;
    }
  }
  bVar4 = (in_RDI->m_setting).m_impulseClamp;
  for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
    if (0.0 < (in_RDI->m_setting).m_impulseClamp) {
      *(float *)(*(long *)(local_10 + 0x10) + (long)(local_8c * (int)local_10[10]) * 4) = -bVar4;
      *(btScalar *)(*(long *)(local_10 + 0x12) + (long)(local_8c * (int)local_10[10]) * 4) = bVar4;
    }
  }
  local_10[0x17] = (in_RDI->m_setting).m_damping;
  return;
}

Assistant:

void btPoint2PointConstraint::getInfo2NonVirtual (btConstraintInfo2* info, const btTransform& body0_trans, const btTransform& body1_trans)
{
	btAssert(!m_useSolveConstraintObsolete);

	 //retrieve matrices

	// anchor points in global coordinates with respect to body PORs.
   
    // set jacobian
    info->m_J1linearAxis[0] = 1;
	info->m_J1linearAxis[info->rowskip+1] = 1;
	info->m_J1linearAxis[2*info->rowskip+2] = 1;

	btVector3 a1 = body0_trans.getBasis()*getPivotInA();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    
	info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	
	btVector3 a2 = body1_trans.getBasis()*getPivotInB();
   
	{
	//	btVector3 a2n = -a2;
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    


    // set right hand side
	btScalar currERP = (m_flags & BT_P2P_FLAGS_ERP) ? m_erp : info->erp;
    btScalar k = info->fps * currERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + body1_trans.getOrigin()[j] - a1[j] - body0_trans.getOrigin()[j]);
		//printf("info->m_constraintError[%d]=%f\n",j,info->m_constraintError[j]);
    }
	if(m_flags & BT_P2P_FLAGS_CFM)
	{
		for (j=0; j<3; j++)
		{
			info->cfm[j*info->rowskip] = m_cfm;
		}
	}

	btScalar impulseClamp = m_setting.m_impulseClamp;//
	for (j=0; j<3; j++)
    {
		if (m_setting.m_impulseClamp > 0)
		{
			info->m_lowerLimit[j*info->rowskip] = -impulseClamp;
			info->m_upperLimit[j*info->rowskip] = impulseClamp;
		}
	}
	info->m_damping = m_setting.m_damping;
	
}